

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::paramCheckFix
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TType *type)

{
  ulong *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ulong uVar4;
  undefined4 extraout_var_14;
  TString local_50;
  
  uVar4 = *(ulong *)&qualifier->field_0x8;
  if ((uVar4 & 0x3ffc00000000000) != 0) {
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var,iVar3) + 8) & 0xfffbffffffffffff | uVar4 & 0x4000000000000
    ;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8) & 0xfff7ffffffffffff |
         uVar4 & 0x8000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_01,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_01,iVar3) + 8) & 0xfffdffffffffffff |
         uVar4 & 0x2000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_02,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_02,iVar3) + 8) & 0xffefffffffffffff |
         uVar4 & 0x10000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_03,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_03,iVar3) + 8) & 0xffdfffffffffffff |
         uVar4 & 0x20000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_04,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0xffbfffffffffffff |
         uVar4 & 0x40000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_05,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_05,iVar3) + 8) & 0xff7fffffffffffff |
         uVar4 & 0x80000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_06,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_06,iVar3) + 8) & 0xfeffffffffffffff |
         uVar4 & 0x100000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_07,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_07,iVar3) + 8) & 0xfdffffffffffffff |
         uVar4 & 0x200000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_08,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_08,iVar3) + 8) & 0xffff7fffffffffff |
         uVar4 & 0x800000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_09,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_09,iVar3) + 8) & 0xfffeffffffffffff |
         uVar4 & 0x1000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
    iVar3 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_10,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_10,iVar3) + 8) & 0xffffbfffffffffff |
         uVar4 & 0x400000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar4 & 0x31e0e0000000) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot use auxiliary or interpolation qualifiers on a function parameter",
               "","");
  }
  bVar2 = TQualifier::hasNonXfbLayout(qualifier);
  if ((bVar2) || (((uint)*(undefined8 *)&qualifier->field_0x24 & 0x7fffffff) != 0x7fffffff)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot use layout qualifiers on a function parameter","","");
  }
  uVar4 = *(ulong *)&qualifier->field_0x8;
  if (((uint)uVar4 >> 0x1c & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"cannot use invariant qualifier on a function parameter","","");
    uVar4 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar4 >> 0x24 & 1) != 0) {
    if (((uint)uVar4 & 0x7f) - 0x11 < 2) {
      iVar3 = (*type->_vptr_TType[10])(type);
      puVar1 = (ulong *)(CONCAT44(extraout_var_11,iVar3) + 8);
      *puVar1 = *puVar1 | 0x1000000000;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,"qualifier has no effect on non-output parameters","precise","");
    }
  }
  uVar4 = *(ulong *)&qualifier->field_0x8;
  if ((uVar4 >> 0x21 & 1) != 0) {
    iVar3 = (*type->_vptr_TType[10])(type);
    puVar1 = (ulong *)(CONCAT44(extraout_var_12,iVar3) + 8);
    *puVar1 = *puVar1 | 0x200000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar4 >> 0x3b & 1) != 0) {
    iVar3 = (*type->_vptr_TType[10])(type);
    puVar1 = (ulong *)(CONCAT44(extraout_var_13,iVar3) + 8);
    *puVar1 = *puVar1 | 0x800000000000000;
    uVar4 = *(ulong *)&qualifier->field_0x8;
  }
  if ((uVar4 >> 0x3c & 1) != 0) {
    iVar3 = (*type->_vptr_TType[7])(type);
    if (iVar3 != 1) {
      iVar3 = (*type->_vptr_TType[7])(type);
      if (iVar3 != 8) {
        iVar3 = (*type->_vptr_TType[7])(type);
        if (iVar3 != 9) {
          iVar3 = (*type->_vptr_TType[7])(type);
          if (iVar3 != 0xc) {
            TType::getBasicTypeString_abi_cxx11_(&local_50,type);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot use spirv_literal qualifier",local_50._M_dataplus._M_p,"");
            goto LAB_004b396f;
          }
        }
      }
    }
    iVar3 = (*type->_vptr_TType[10])(type);
    puVar1 = (ulong *)(CONCAT44(extraout_var_14,iVar3) + 8);
    *puVar1 = *puVar1 | 0x1000000000000000;
  }
LAB_004b396f:
  local_50._M_dataplus.super_allocator_type.allocator._0_4_ = *(uint *)&qualifier->field_0x8 & 0x7f;
  paramCheckFixStorage(this,loc,(TStorageQualifier *)&local_50,type);
  return;
}

Assistant:

void TParseContext::paramCheckFix(const TSourceLoc& loc, const TQualifier& qualifier, TType& type)
{
    if (qualifier.isMemory()) {
        type.getQualifier().volatil   = qualifier.volatil;
        type.getQualifier().nontemporal   = qualifier.nontemporal;
        type.getQualifier().coherent  = qualifier.coherent;
        type.getQualifier().devicecoherent  = qualifier.devicecoherent ;
        type.getQualifier().queuefamilycoherent  = qualifier.queuefamilycoherent;
        type.getQualifier().workgroupcoherent  = qualifier.workgroupcoherent;
        type.getQualifier().subgroupcoherent  = qualifier.subgroupcoherent;
        type.getQualifier().shadercallcoherent = qualifier.shadercallcoherent;
        type.getQualifier().nonprivate = qualifier.nonprivate;
        type.getQualifier().readonly  = qualifier.readonly;
        type.getQualifier().writeonly = qualifier.writeonly;
        type.getQualifier().restrict  = qualifier.restrict;
    }

    if (qualifier.isAuxiliary() ||
        qualifier.isInterpolation())
        error(loc, "cannot use auxiliary or interpolation qualifiers on a function parameter", "", "");
    if (qualifier.hasLayout())
        error(loc, "cannot use layout qualifiers on a function parameter", "", "");
    if (qualifier.invariant)
        error(loc, "cannot use invariant qualifier on a function parameter", "", "");
    if (qualifier.isNoContraction()) {
        if (qualifier.isParamOutput())
            type.getQualifier().setNoContraction();
        else
            warn(loc, "qualifier has no effect on non-output parameters", "precise", "");
    }
    if (qualifier.isNonUniform())
        type.getQualifier().nonUniform = qualifier.nonUniform;
    if (qualifier.isSpirvByReference())
        type.getQualifier().setSpirvByReference();
    if (qualifier.isSpirvLiteral()) {
        if (type.getBasicType() == EbtFloat || type.getBasicType() == EbtInt || type.getBasicType() == EbtUint ||
            type.getBasicType() == EbtBool)
            type.getQualifier().setSpirvLiteral();
        else
            error(loc, "cannot use spirv_literal qualifier", type.getBasicTypeString().c_str(), "");
    }

    paramCheckFixStorage(loc, qualifier.storage, type);
}